

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.h
# Opt level: O0

timespec __thiscall
absl::synchronization_internal::KernelTimeout::MakeAbsTimespec(KernelTimeout *this)

{
  timespec tVar1;
  long *plVar2;
  long local_48;
  long local_40 [2];
  int64_t seconds;
  char *absl_raw_logging_internal_basename;
  int64_t n;
  KernelTimeout *this_local;
  timespec abstime;
  
  absl_raw_logging_internal_basename = (char *)this->ns_;
  n = (int64_t)this;
  if (absl_raw_logging_internal_basename == (char *)0x0) {
    seconds = (long)
              "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/synchronization/internal/kernel_timeout.h"
              + 0x6b;
    raw_logging_internal::RawLog
              (kError,"kernel_timeout.h",0x85,
               "Tried to create a timespec from a non-timeout; never do this.");
    absl_raw_logging_internal_basename = (char *)std::numeric_limits<long>::max();
  }
  if ((long)absl_raw_logging_internal_basename < 0) {
    absl_raw_logging_internal_basename = (char *)0x0;
  }
  local_40[0] = (long)absl_raw_logging_internal_basename / 1000000000;
  local_48 = std::numeric_limits<long>::max();
  plVar2 = std::min<long>(local_40,&local_48);
  tVar1.tv_nsec = (long)absl_raw_logging_internal_basename % 1000000000;
  tVar1.tv_sec = *plVar2;
  return tVar1;
}

Assistant:

inline struct timespec KernelTimeout::MakeAbsTimespec() {
  int64_t n = ns_;
  static const int64_t kNanosPerSecond = 1000 * 1000 * 1000;
  if (n == 0) {
    ABSL_RAW_LOG(
        ERROR, "Tried to create a timespec from a non-timeout; never do this.");
    // But we'll try to continue sanely.  no-timeout ~= saturated timeout.
    n = (std::numeric_limits<int64_t>::max)();
  }

  // Kernel APIs validate timespecs as being at or after the epoch,
  // despite the kernel time type being signed.  However, no one can
  // tell the difference between a timeout at or before the epoch (since
  // all such timeouts have expired!)
  if (n < 0) n = 0;

  struct timespec abstime;
  int64_t seconds = (std::min)(n / kNanosPerSecond,
                               int64_t{(std::numeric_limits<time_t>::max)()});
  abstime.tv_sec = static_cast<time_t>(seconds);
  abstime.tv_nsec = static_cast<decltype(abstime.tv_nsec)>(n % kNanosPerSecond);
  return abstime;
}